

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman_tests.cpp
# Opt level: O2

void __thiscall wallet::scriptpubkeyman_tests::CanProvide::test_method(CanProvide *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  Chain *chain;
  MockableData records;
  int iVar3;
  LegacyScriptPubKeyMan *pLVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  CKey *key;
  pointer this_00;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  undefined4 in_stack_fffffffffffff628;
  undefined4 in_stack_fffffffffffff62c;
  check_type cVar7;
  undefined8 in_stack_fffffffffffff638;
  undefined8 in_stack_fffffffffffff640;
  undefined8 in_stack_fffffffffffff648;
  size_t in_stack_fffffffffffff650;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  assertion_result local_980;
  undefined1 *local_968;
  undefined1 *local_960;
  char *local_958;
  char *local_950;
  vector<CPubKey,_std::allocator<CPubKey>_> pubkeys;
  vector<CKey,_std::allocator<CKey>_> keys;
  long *local_910;
  undefined1 local_908 [24];
  char **local_8f0;
  SignatureData data;
  CScript p2sh_script;
  CScript multisig_script;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_518;
  CWallet wallet;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  chain = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.chain._M_t.
          super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
          super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"",(allocator<char> *)&multisig_script);
  local_518._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_518._M_impl.super__Rb_tree_header._M_header;
  local_518._M_impl._0_8_ = 0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_518._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_518._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl._4_4_ = in_stack_fffffffffffff62c;
  records._M_t._M_impl._0_4_ = in_stack_fffffffffffff628;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (undefined8)_cVar7;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff638;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff640;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff648;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff650;
  local_518._M_impl.super__Rb_tree_header._M_header._M_right =
       local_518._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records);
  CWallet::CWallet(&wallet,chain,(string *)&data,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_910);
  if (local_910 != (long *)0x0) {
    (**(code **)(*local_910 + 8))();
  }
  local_910 = (long *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_518);
  std::__cxx11::string::~string((string *)&data);
  pLVar4 = CWallet::GetOrCreateLegacyScriptPubKeyMan(&wallet);
  std::vector<CKey,_std::allocator<CKey>_>::vector(&keys,2,(allocator_type *)&data);
  pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (this_00 = keys.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.
                 super__Vector_impl_data._M_start;
      this_00 !=
      keys.super__Vector_base<CKey,_std::allocator<CKey>_>._M_impl.super__Vector_impl_data._M_finish
      ; this_00 = this_00 + 1) {
    CKey::MakeNewKey(this_00,true);
    CKey::GetPubKey((CPubKey *)&data,this_00);
    std::vector<CPubKey,_std::allocator<CPubKey>_>::emplace_back<CPubKey>(&pubkeys,(CPubKey *)&data)
    ;
  }
  GetScriptForMultisig(&multisig_script,1,&pubkeys);
  ScriptHash::ScriptHash((ScriptHash *)local_908,&multisig_script);
  data.scriptSig.super_CScriptBase._union.indirect_contents.capacity = local_908._16_4_;
  data.complete = (bool)local_908[0];
  data.witness = (bool)local_908[1];
  data._2_6_ = local_908._2_6_;
  data.witness_script.super_CScriptBase._union.direct[0] = '\x03';
  GetScriptForDestination(&p2sh_script,(CTxDestination *)&data);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&data);
  data._0_8_ = data._0_8_ & 0xffffffffffff0000;
  p_Var1 = &data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header;
  data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&data.scriptSig,0,0xb8);
  data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  data.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  data.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  data.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  data.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_958 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/scriptpubkeyman_tests.cpp"
  ;
  local_950 = "";
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x26;
  file.m_begin = (iterator)&local_958;
  data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  data.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       data.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_968,msg);
  iVar3 = (*(pLVar4->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x16])
                    (pLVar4,&p2sh_script,&data);
  local_980.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)iVar3 ^ 1);
  local_980.m_message.px = (element_type *)0x0;
  local_980.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_990 = "!keyman.CanProvide(p2sh_script, data)";
  local_988 = "";
  local_908[8] = false;
  local_908._0_8_ = &PTR__lazy_ostream_0113a070;
  local_908._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/scriptpubkeyman_tests.cpp"
  ;
  local_998 = "";
  pvVar5 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  local_8f0 = &local_990;
  boost::test_tools::tt_detail::report_assertion
            (&local_980,(lazy_ostream *)local_908,1,0,WARN,_cVar7,(size_t)&local_9a0,0x26);
  boost::detail::shared_count::~shared_count(&local_980.m_message.pn);
  (*(pLVar4->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x24])
            (pLVar4,&multisig_script);
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  file_00.m_end = &DAT_00000028;
  file_00.m_begin = &stack0xfffffffffffff650;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffff640,msg_00);
  iVar3 = (*(pLVar4->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x16])
                    (pLVar4,&p2sh_script,&data);
  local_980.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB41(iVar3,0);
  local_980.m_message.px = (element_type *)0x0;
  local_980.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_990 = "keyman.CanProvide(p2sh_script, data)";
  local_988 = "";
  local_908[8] = false;
  local_908._0_8_ = &PTR__lazy_ostream_0113a070;
  local_908._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_8f0 = &local_990;
  boost::test_tools::tt_detail::report_assertion
            (&local_980,(lazy_ostream *)local_908,1,0,WARN,0xc829e1,(size_t)&stack0xfffffffffffff630
             ,0x28);
  boost::detail::shared_count::~shared_count(&local_980.m_message.pn);
  SignatureData::~SignatureData(&data);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&p2sh_script.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&multisig_script.super_CScriptBase);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            (&pubkeys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>);
  std::vector<CKey,_std::allocator<CKey>_>::~vector(&keys);
  CWallet::~CWallet(&wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(CanProvide)
{
    // Set up wallet and keyman variables.
    CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
    LegacyScriptPubKeyMan& keyman = *wallet.GetOrCreateLegacyScriptPubKeyMan();

    // Make a 1 of 2 multisig script
    std::vector<CKey> keys(2);
    std::vector<CPubKey> pubkeys;
    for (CKey& key : keys) {
        key.MakeNewKey(true);
        pubkeys.emplace_back(key.GetPubKey());
    }
    CScript multisig_script = GetScriptForMultisig(1, pubkeys);
    CScript p2sh_script = GetScriptForDestination(ScriptHash(multisig_script));
    SignatureData data;

    // Verify the p2sh(multisig) script is not recognized until the multisig
    // script is added to the keystore to make it solvable
    BOOST_CHECK(!keyman.CanProvide(p2sh_script, data));
    keyman.AddCScript(multisig_script);
    BOOST_CHECK(keyman.CanProvide(p2sh_script, data));
}